

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point.cpp
# Opt level: O2

void __thiscall ezc3d::DataNS::Points3dNS::Point::set(Point *this,double x,double y,double z)

{
  double *pdVar1;
  int iVar2;
  undefined8 uVar3;
  
  Vector3d::set(&this->super_Vector3d,x,y,z);
  iVar2 = (*(this->super_Vector3d).super_Matrix._vptr_Matrix[0x20])(this);
  uVar3 = 0xbff0000000000000;
  if ((char)iVar2 != '\0') {
    pdVar1 = (this->super_Vector3d).super_Matrix._data.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    if ((((*pdVar1 != 0.0) || (NAN(*pdVar1))) || (pdVar1[1] != 0.0)) ||
       (((NAN(pdVar1[1]) || (pdVar1[2] != 0.0)) || (NAN(pdVar1[2]))))) {
      uVar3 = 0;
    }
  }
  (*(this->super_Vector3d).super_Matrix._vptr_Matrix[0x29])(uVar3,this);
  return;
}

Assistant:

void ezc3d::DataNS::Points3dNS::Point::set(double x, double y, double z) {
  ezc3d::Vector3d::set(x, y, z);
  if (!isValid() || (_data[0] == 0.0 && _data[1] == 0.0 && _data[2] == 0.0)) {
    residual(-1);
  } else {
    residual(0);
  }
}